

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_7b0417::HandleToUpperLowerCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool toUpper,cmExecutionStatus *status)

{
  pointer pbVar1;
  ulong uVar2;
  string_view value;
  string output;
  char *local_60;
  size_t local_58;
  char local_50 [16];
  string local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (uVar2 < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"no output variable specified",(allocator<char> *)&local_40);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    local_60 = local_50;
    local_58 = 0;
    local_50[0] = '\0';
    if (toUpper) {
      cmsys::SystemTools::UpperCase(&local_40,pbVar1 + 1);
    }
    else {
      cmsys::SystemTools::LowerCase(&local_40,pbVar1 + 1);
    }
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    value._M_str = local_60;
    value._M_len = local_58;
    cmMakefile::AddDefinition(status->Makefile,pbVar1 + 2,value);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return 0x40 < uVar2;
}

Assistant:

bool HandleToUpperLowerCommand(std::vector<std::string> const& args,
                               bool toUpper, cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("no output variable specified");
    return false;
  }

  std::string const& outvar = args[2];
  std::string output;

  if (toUpper) {
    output = cmSystemTools::UpperCase(args[1]);
  } else {
    output = cmSystemTools::LowerCase(args[1]);
  }

  // Store the output in the provided variable.
  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}